

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

void av1_calc_mb_wiener_var_row
               (AV1_COMP *cpi,MACROBLOCK *x,MACROBLOCKD *xd,int mi_row,int16_t *src_diff,
               tran_low_t *coeff,tran_low_t *qcoeff,tran_low_t *dqcoeff,double *sum_rec_distortion,
               double *sum_est_rate,uint8_t *pred_buffer)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  SequenceHeader *pSVar4;
  int16_t *piVar5;
  WeberStats *pWVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  TX_SIZE tx_size;
  AV1_COMP *pAVar11;
  MACROBLOCKD *pMVar12;
  uint8_t *puVar13;
  BitDepthInfo BVar14;
  tran_low_t *ptVar15;
  int mi_ext_col;
  int iVar16;
  int iVar17;
  ulong uVar18;
  byte bVar19;
  short sVar20;
  int iVar21;
  int iVar22;
  MB_MODE_INFO *pMVar23;
  MB_MODE_INFO **ppMVar24;
  PREDICTION_MODE mode;
  int pix_col;
  ulong uVar25;
  PREDICTION_MODE mode_00;
  uint uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  byte bVar33;
  int iVar34;
  long lVar35;
  byte bVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  AV1_COMP *pAVar44;
  uint16_t eob;
  byte local_23a;
  BLOCK_SIZE local_239;
  AV1_COMP *local_238;
  uint16_t *local_230;
  int local_228;
  int local_224;
  MACROBLOCKD *local_220;
  MACROBLOCK *local_218;
  uint8_t *local_210;
  int local_204;
  uint local_200;
  int est_block_rate;
  uint8_t *local_1f8;
  ulong local_1f0;
  int local_1e4;
  uint local_1e0;
  uint local_1dc;
  ulong local_1d8;
  long local_1d0;
  ulong local_1c8;
  SCAN_ORDER *local_1c0;
  uint8_t *local_1b8;
  uint8_t *local_1b0;
  int64_t est_block_dist;
  int local_1a0;
  uint local_19c;
  int local_198;
  uint local_194;
  AV1EncRowMultiThreadSync *local_190;
  long local_188;
  BitDepthInfo local_180;
  int16_t *local_178;
  tran_low_t *local_170;
  uint8_t *local_168;
  ulong local_160;
  ulong local_158;
  uint16_t *rec;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  long local_128;
  long local_120;
  ulong local_118;
  MB_MODE_INFO *mbmi_ptr;
  QUANT_PARAM quant_param;
  MB_MODE_INFO mbmi;
  
  uVar38 = (ulong)(uint)mi_row;
  local_1b8 = (cpi->source->field_5).buffers[0];
  iVar17 = (cpi->source->field_4).field_0.y_stride;
  local_218 = x;
  local_178 = src_diff;
  local_170 = coeff;
  memset(&mbmi,0,0xb0);
  xd->mi = &mbmi_ptr;
  local_239 = cpi->weber_bsize;
  local_1c8 = (ulong)local_239;
  local_23a = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [local_1c8];
  local_1f0 = (ulong)local_23a;
  uVar26 = (uint)xd->cur_buf->flags >> 3;
  uVar2 = (cpi->common).mi_params.mi_cols;
  local_138 = (ulong)uVar2;
  local_228 = mi_row / (int)(uint)local_23a;
  local_1e4 = uVar2 + 0x17;
  if (-1 < (int)(uVar2 + 8)) {
    local_1e4 = uVar2 + 8;
  }
  local_210 = (uint8_t *)((ulong)pred_buffer >> 1);
  if ((uVar26 & 1) == 0) {
    local_210 = pred_buffer;
  }
  local_220 = xd;
  if (0 < (int)uVar2) {
    local_1d8 = (ulong)""[local_1c8];
    uVar2 = tx_size_wide[local_1d8];
    local_188 = (long)(int)uVar2;
    local_1dc = uVar2 * uVar2;
    local_180 = (BitDepthInfo)(CONCAT44(uVar26,xd->bd) & 0x1ffffffff);
    local_190 = &cpi->ppi->intra_row_mt_sync;
    local_1e4 = local_1e4 >> 4;
    local_198 = mi_row * -0x20;
    local_140 = 0x3efffcL >> (local_239 & 0x3f);
    local_148 = 0x20005L >> (local_239 & 0x3f);
    local_1a0 = mi_row + -1;
    local_1b8 = local_1b8 + iVar17 * mi_row * 4;
    local_1c0 = av1_scan_orders[""[local_1c8]];
    local_160 = 1;
    if (1 < (int)uVar2) {
      local_160 = (ulong)uVar2;
    }
    local_19c = local_23a - 1;
    local_1e0 = (uint)local_23a * 4;
    rec = (uint16_t *)((long)local_210 * 2);
    local_158 = (ulong)local_1dc;
    local_120 = (long)iVar17 * 2;
    local_200 = 0;
    local_204 = 0;
    local_230 = (uint16_t *)0x0;
    local_238 = cpi;
    local_1d0 = (long)iVar17;
    local_130 = uVar38;
    mbmi_ptr = &mbmi;
    do {
      pAVar44 = local_238;
      if (((ulong)local_230 & 0xf) == 0) {
        (*(local_238->mt_info).intra_mt.intra_sync_read_ptr)(local_190,local_228,local_204);
        pAVar11 = local_238;
        iVar17 = (pAVar44->mt_info).num_workers;
        iVar16 = (pAVar44->mt_info).num_mod_workers[0xb];
        if (iVar16 < iVar17) {
          iVar17 = iVar16;
        }
        if (iVar17 < 2) {
LAB_0019068b:
          iVar17 = 0;
        }
        else {
          pthread_mutex_lock((pthread_mutex_t *)(local_238->mt_info).enc_row_mt.mutex_);
          _Var1 = (pAVar11->mt_info).enc_row_mt.mb_wiener_mt_exit;
          pthread_mutex_unlock((pthread_mutex_t *)(pAVar11->mt_info).enc_row_mt.mutex_);
          if (_Var1 == false) goto LAB_0019068b;
          iVar17 = (uint)_Var1 * 2;
        }
        if (iVar17 != 0) break;
      }
      bVar19 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [local_1c8];
      iVar17 = (local_238->common).mi_params.mi_stride;
      uVar41 = (uint)uVar38;
      uVar26 = (uint)local_230;
      iVar21 = (int)((long)((ulong)(uint)((int)uVar41 >> 0x1f) << 0x20 | uVar38 & 0xffffffff) /
                    (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(local_238->common).mi_params.mi_alloc_bsize]);
      iVar16 = (int)((long)((ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 |
                           (ulong)local_230 & 0xffffffff) /
                    (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(local_238->common).mi_params.mi_alloc_bsize]);
      iVar34 = iVar17 * uVar41 + uVar26;
      (local_238->common).mi_params.mi_grid_base[iVar34] =
           (local_238->common).mi_params.mi_alloc +
           ((local_238->common).mi_params.mi_alloc_stride * iVar21 + iVar16);
      ppMVar24 = (local_238->common).mi_params.mi_grid_base + iVar34;
      local_220->mi = ppMVar24;
      local_220->tx_type_map = (local_238->common).mi_params.tx_type_map + iVar34;
      local_220->tx_type_map_stride = iVar17;
      local_218->mbmi_ext_frame =
           (local_238->mbmi_ext_info).frame_base +
           (iVar21 * (local_238->mbmi_ext_info).stride + iVar16);
      iVar16 = bVar19 + uVar41;
      iVar17 = (local_238->common).mi_params.mi_rows;
      uVar2 = (local_238->common).mi_params.mi_cols;
      if (iVar16 < iVar17) {
        iVar17 = iVar16;
      }
      local_194 = uVar26 + (int)local_1f0;
      if ((int)local_194 < (int)uVar2) {
        uVar2 = local_194;
      }
      local_220->mb_to_top_edge = local_198;
      local_220->mb_to_bottom_edge = (iVar17 - iVar16) * 0x20;
      local_220->mb_to_left_edge = uVar26 * -0x20;
      local_220->mb_to_right_edge = (uVar2 - local_194) * 0x20;
      local_220->mi_row = uVar41;
      local_220->mi_col = uVar26;
      iVar17 = (local_220->tile).mi_row_start;
      iVar16 = (local_220->tile).mi_col_start;
      local_220->left_available = iVar16 < (int)uVar26;
      local_220->up_available = iVar17 < (int)uVar41;
      uVar2 = local_220->plane[1].subsampling_x;
      uVar3 = local_220->plane[1].subsampling_y;
      local_220->chroma_up_available = iVar17 < (int)uVar41;
      bVar32 = iVar16 < (int)(uVar26 - 1);
      if (uVar2 == 0) {
        bVar32 = iVar16 < (int)uVar26;
      }
      if ((local_140 & 1) != 0) {
        bVar32 = iVar16 < (int)uVar26;
      }
      local_220->chroma_left_available = bVar32;
      if (uVar3 != 0 && (local_148 & 1) != 0) {
        local_220->chroma_up_available = iVar17 < local_1a0;
      }
      if (iVar17 < (int)uVar41) {
        local_220->above_mbmi = ppMVar24[-(long)local_220->mi_stride];
      }
      else {
        local_220->above_mbmi = (MB_MODE_INFO *)0x0;
      }
      if (iVar16 < (int)uVar26) {
        local_220->left_mbmi = ppMVar24[-1];
      }
      else {
        local_220->left_mbmi = (MB_MODE_INFO *)0x0;
      }
      if (((uVar38 & 1) == 0) && ((bVar19 & uVar3 != 0) != 0)) {
        local_220->is_chroma_ref = false;
      }
      else {
        if (((ulong)local_230 & 1) == 0 && (local_23a & 1) != 0) {
          local_220->is_chroma_ref = uVar2 == 0;
          if (uVar2 != 0) goto LAB_0019094b;
        }
        else {
          local_220->is_chroma_ref = true;
        }
        iVar21 = local_220->mi_stride;
        iVar34 = (uVar2 & uVar26) + (uVar3 & uVar41) * iVar21;
        if (local_220->chroma_up_available == true) {
          pMVar23 = ppMVar24[(long)-iVar34 + (long)(int)(uVar2 - iVar21)];
        }
        else {
          pMVar23 = (MB_MODE_INFO *)0x0;
        }
        local_220->chroma_above_mbmi = pMVar23;
        if (bVar32 == false) {
          pMVar23 = (MB_MODE_INFO *)0x0;
        }
        else {
          pMVar23 = ppMVar24[(long)-iVar34 + (long)(int)(iVar21 * uVar3) + -1];
        }
        local_220->chroma_left_mbmi = pMVar23;
      }
LAB_0019094b:
      local_220->height = bVar19;
      local_220->width = local_23a;
      local_220->is_last_vertical_rect = false;
      if ((local_23a < bVar19) && ((bVar19 - 1 & (int)local_1f0 + uVar26) == 0)) {
        local_220->is_last_vertical_rect = true;
      }
      local_1b0 = local_1b8 + local_200;
      local_220->is_first_horizontal_rect = bVar19 < local_23a && (local_19c & uVar41) == 0;
      lVar27 = 0xa30;
      if (((local_238->common).seq_params)->monochrome == '\0') {
        lVar27 = 0x1e90;
      }
      lVar30 = 0;
      do {
        bVar33 = (byte)(((uint)bVar19 << 2) >>
                       (*(byte *)((long)local_220->plane[0].pre + lVar30 + -0x28) & 0x1f));
        bVar36 = (byte)(local_1e0 >>
                       (*(byte *)((long)local_220->plane[0].pre + lVar30 + -0x2c) & 0x1f));
        if (bVar36 < 5) {
          bVar36 = 4;
        }
        *(byte *)((long)(local_220->plane[0].seg_iqmatrix + -1) + lVar30 + 0x90) = bVar36;
        if (bVar33 < 5) {
          bVar33 = 4;
        }
        *(byte *)((long)(local_220->plane[0].seg_iqmatrix + -1) + lVar30 + 0x91) = bVar33;
        lVar30 = lVar30 + 0xa30;
      } while (lVar27 != lVar30);
      pMVar23 = *ppMVar24;
      pMVar23->bsize = local_239;
      pMVar23->motion_mode = '\0';
      if (iVar17 < (int)uVar41) {
        local_220->above_mbmi = (MB_MODE_INFO *)0x0;
      }
      if (iVar16 < (int)uVar26) {
        local_220->left_mbmi = (MB_MODE_INFO *)0x0;
      }
      local_1f8 = local_1b8 + uVar26 * 4;
      local_224 = 0x7fffffff;
      mode_00 = '\0';
      mode = '\0';
      do {
        lVar27 = local_188;
        puVar13 = local_1f8;
        pSVar4 = (local_238->common).seq_params;
        iVar17 = (int)local_188;
        av1_predict_intra_block
                  (local_220,pSVar4->sb_size,(uint)pSVar4->enable_intra_edge_filter,iVar17,iVar17,
                   (TX_SIZE)local_1d8,mode,0,0,'\x05',local_1f8,(int)local_1d0,local_210,0x80,0,0,0)
        ;
        piVar5 = local_178;
        BVar14 = local_180;
        av1_subtract_block(local_180,iVar17,iVar17,local_178,lVar27,puVar13,local_1d0,local_210,0x80
                          );
        ptVar15 = local_170;
        av1_quick_txfm(0,(TX_SIZE)local_1d8,BVar14,piVar5,iVar17,local_170);
        iVar17 = (*aom_satd)(ptVar15,local_1dc);
        lVar30 = local_188;
        lVar27 = local_1d0;
        uVar38 = local_1d8;
        puVar13 = local_1f8;
        if (iVar17 < local_224) {
          local_224 = iVar17;
          mode_00 = mode;
        }
        mode = mode + '\x01';
      } while (mode != '\r');
      pSVar4 = (local_238->common).seq_params;
      iVar17 = (int)local_188;
      tx_size = (TX_SIZE)local_1d8;
      av1_predict_intra_block
                (local_220,pSVar4->sb_size,(uint)pSVar4->enable_intra_edge_filter,iVar17,iVar17,
                 tx_size,mode_00,0,0,'\x05',local_1f8,(int)local_1d0,local_210,0x80,0,0,0);
      piVar5 = local_178;
      BVar14 = local_180;
      av1_subtract_block(local_180,iVar17,iVar17,local_178,lVar30,puVar13,lVar27,local_210,0x80);
      ptVar15 = local_170;
      av1_quick_txfm(0,tx_size,BVar14,piVar5,iVar17,local_170);
      bVar19 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[txsize_to_bsize[uVar38]]
      ;
      av1_setup_quant(tx_size,0,0,0,&quant_param);
      pAVar44 = local_238;
      local_128 = (long)(1 << (bVar19 & 0x1f));
      if ((local_220->cur_buf->flags & 8) == 0) {
        av1_quantize_fp_facade
                  (ptVar15,local_128,local_218->plane,qcoeff,dqcoeff,&eob,local_1c0,&quant_param);
      }
      else {
        av1_highbd_quantize_fp_facade
                  (ptVar15,local_128,local_218->plane,qcoeff,dqcoeff,&eob,local_1c0,&quant_param);
      }
      if ((pAVar44->oxcf).enable_rate_guide_deltaq != 0) {
        uVar43 = (ulong)eob;
        if (uVar43 == 0) {
          iVar17 = 0x200;
        }
        else {
          piVar5 = ((SCAN_ORDER *)&local_1c0->scan)->scan;
          iVar17 = 1;
          uVar38 = 0;
          do {
            iVar16 = qcoeff[piVar5[uVar38]];
            iVar21 = -iVar16;
            if (0 < iVar16) {
              iVar21 = iVar16;
            }
            dVar10 = log1p((double)iVar21);
            iVar17 = (iVar17 - (uint)(iVar16 == 0)) + (int)(dVar10 / 0.6931471805599453) + 2;
            uVar38 = uVar38 + 1;
          } while (uVar43 != uVar38);
          iVar17 = iVar17 * 0x200;
          uVar38 = local_1d8;
        }
        local_238->prep_rate_estimates
        [(int)(((ulong)local_230 & 0xffffffff) / (local_1f0 & 0xffffffff)) +
         (local_238->frame_info).mi_cols * local_228] = iVar17;
        pAVar44 = local_238;
      }
      puVar13 = local_210;
      pMVar12 = local_220;
      av1_inverse_transform_block
                (local_220,dqcoeff,0,'\0',(TX_SIZE)uVar38,local_210,0x80,(uint)eob,0);
      uVar38 = local_130;
      uVar43 = local_158;
      pWVar6 = pAVar44->mb_weber_stats;
      iVar17 = (int)(((ulong)local_230 & 0xffffffff) / (local_1f0 & 0xffffffff)) +
               (pAVar44->frame_info).mi_cols * local_228;
      pWVar6[iVar17].src_pix_max = 1;
      pWVar6[iVar17].rec_pix_max = 1;
      pWVar6[iVar17].src_variance = 0;
      (&pWVar6[iVar17].src_variance)[1] = 0;
      pWVar6[iVar17].distortion = 0;
      uVar2 = pMVar12->cur_buf->flags;
      uVar18 = 1;
      local_230 = rec;
      lVar28 = 0;
      uVar29 = 1;
      lVar31 = 0;
      lVar35 = 0;
      lVar40 = 0;
      lVar39 = 0;
      lVar30 = 0;
      lVar27 = (long)local_1f8 * 2;
      uVar25 = 0;
      local_168 = puVar13;
      do {
        local_118 = uVar25;
        local_1f8 = (uint8_t *)lVar27;
        uVar25 = 0;
        do {
          if ((uVar2 & 8) == 0) {
            uVar42 = (ulong)local_1b0[uVar25];
            uVar37 = (ulong)local_168[uVar25];
          }
          else {
            uVar42 = (ulong)*(ushort *)((long)local_1f8 + uVar25 * 2);
            uVar37 = (ulong)local_230[uVar25];
          }
          iVar34 = (int)uVar42;
          lVar30 = lVar30 + uVar42;
          iVar21 = (int)uVar37;
          lVar39 = lVar39 + uVar37;
          iVar16 = iVar34 - iVar21;
          lVar40 = lVar40 + iVar16;
          lVar35 = lVar35 + (ulong)(uint)(iVar34 * iVar34);
          pWVar6[iVar17].src_variance = lVar35;
          lVar31 = lVar31 + (ulong)(uint)(iVar21 * iVar21);
          sVar20 = (short)uVar29;
          uVar29 = (ulong)(uint)(int)sVar20;
          if (sVar20 <= iVar34) {
            uVar29 = uVar42;
          }
          pWVar6[iVar17].rec_variance = lVar31;
          pWVar6[iVar17].src_pix_max = (int16_t)uVar29;
          sVar20 = (short)uVar18;
          uVar18 = (ulong)(uint)(int)sVar20;
          if (sVar20 <= iVar21) {
            uVar18 = uVar37;
          }
          pWVar6[iVar17].rec_pix_max = (int16_t)uVar18;
          lVar28 = lVar28 + (ulong)(uint)(iVar16 * iVar16);
          pWVar6[iVar17].distortion = lVar28;
          uVar25 = uVar25 + 1;
        } while (local_160 != uVar25);
        local_168 = local_168 + 0x80;
        local_1b0 = local_1b0 + local_1d0;
        local_230 = local_230 + 0x80;
        lVar27 = (long)local_1f8 + local_120;
        uVar25 = local_118 + 1;
      } while (local_118 + 1 != local_160);
      if ((local_238->oxcf).intra_mode_cfg.auto_intra_tools_off != false) {
        *sum_rec_distortion = (double)pWVar6[iVar17].distortion + *sum_rec_distortion;
        est_block_rate = 0;
        est_block_dist = 0;
        bVar19 = 3;
        if ((((local_218->e_mbd).cur_buf)->flags & 8) != 0) {
          bVar19 = (char)(local_218->e_mbd).bd - 5;
        }
        lVar27 = pWVar6[iVar17].distortion;
        if ((local_238->sf).rd_sf.simple_model_rd_from_var == 0) {
          av1_model_rd_from_var_lapndz
                    (lVar27,(uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                                  [local_1c8],
                     (int)local_218->plane[0].dequant_QTX[1] >> (bVar19 & 0x1f),&est_block_rate,
                     &est_block_dist);
        }
        else {
          iVar16 = (int)local_218->plane[0].dequant_QTX[1] >> (bVar19 & 0x1f);
          lVar28 = 0;
          if ((iVar16 < 0x78) &&
             (lVar28 = (long)((ulong)(0x118 - iVar16) * lVar27) >> 7, 0x7ffffffe < lVar28)) {
            lVar28 = 0x7fffffff;
          }
          est_block_rate = (int)lVar28;
          est_block_dist = lVar27 * iVar16 >> 8;
        }
        est_block_dist = est_block_dist << 4;
        *sum_est_rate = (double)est_block_rate + *sum_est_rate;
      }
      uVar2 = local_194;
      iVar16 = local_204;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = lVar30 * lVar30;
      pWVar6[iVar17].src_variance =
           pWVar6[iVar17].src_variance - SUB168(auVar7 / SEXT816(local_128),0);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = lVar39 * lVar39;
      pWVar6[iVar17].rec_variance =
           pWVar6[iVar17].rec_variance - SUB168(auVar8 / SEXT816(local_128),0);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = lVar40 * lVar40;
      pWVar6[iVar17].distortion = pWVar6[iVar17].distortion - SUB168(auVar9 / SEXT816(local_128),0);
      pWVar6[iVar17].satd = (long)local_224;
      *qcoeff = 0;
      dVar10 = 0.0;
      if (1 < local_1dc) {
        iVar21 = 0;
        uVar18 = 1;
        do {
          iVar34 = qcoeff[uVar18];
          iVar22 = -iVar34;
          if (0 < iVar34) {
            iVar22 = iVar34;
          }
          if (iVar22 < iVar21) {
            iVar22 = iVar21;
          }
          iVar21 = iVar22;
          uVar18 = uVar18 + 1;
        } while (uVar43 != uVar18);
        dVar10 = (double)iVar21;
      }
      pWVar6[iVar17].max_scale = dVar10;
      iVar17 = (int)local_138;
      if (iVar17 <= (int)local_194 || (local_194 & 0xf) == 0) {
        (*(local_238->mt_info).intra_mt.intra_sync_write_ptr)
                  (local_190,local_228,local_204,local_1e4);
        local_204 = iVar16 + 1;
      }
      local_200 = local_200 + local_1e0;
      local_230 = (uint16_t *)(ulong)uVar2;
    } while ((int)uVar2 < iVar17);
  }
  local_220->mi = (MB_MODE_INFO **)0x0;
  return;
}

Assistant:

void av1_calc_mb_wiener_var_row(AV1_COMP *const cpi, MACROBLOCK *x,
                                MACROBLOCKD *xd, const int mi_row,
                                int16_t *src_diff, tran_low_t *coeff,
                                tran_low_t *qcoeff, tran_low_t *dqcoeff,
                                double *sum_rec_distortion,
                                double *sum_est_rate, uint8_t *pred_buffer) {
  AV1_COMMON *const cm = &cpi->common;
  uint8_t *buffer = cpi->source->y_buffer;
  int buf_stride = cpi->source->y_stride;
  MB_MODE_INFO mbmi;
  memset(&mbmi, 0, sizeof(mbmi));
  MB_MODE_INFO *mbmi_ptr = &mbmi;
  xd->mi = &mbmi_ptr;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const TX_SIZE tx_size = max_txsize_lookup[bsize];
  const int block_size = tx_size_wide[tx_size];
  const int coeff_count = block_size * block_size;
  const int mb_step = mi_size_wide[bsize];
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  const MultiThreadInfo *const mt_info = &cpi->mt_info;
  const AV1EncAllIntraMultiThreadInfo *const intra_mt = &mt_info->intra_mt;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;
  const int mi_cols = cm->mi_params.mi_cols;
  const int mt_thread_id = mi_row / mb_step;
  // TODO(chengchen): test different unit step size
  const int mt_unit_step = mi_size_wide[MB_WIENER_MT_UNIT_SIZE];
  const int mt_unit_cols = (mi_cols + (mt_unit_step >> 1)) / mt_unit_step;
  int mt_unit_col = 0;
  const int is_high_bitdepth = is_cur_buf_hbd(xd);

  uint8_t *dst_buffer = pred_buffer;
  const int dst_buffer_stride = MB_WIENER_PRED_BUF_STRIDE;

  if (is_high_bitdepth) {
    uint16_t *pred_buffer_16 = (uint16_t *)pred_buffer;
    dst_buffer = CONVERT_TO_BYTEPTR(pred_buffer_16);
  }

  for (int mi_col = 0; mi_col < mi_cols; mi_col += mb_step) {
    if (mi_col % mt_unit_step == 0) {
      intra_mt->intra_sync_read_ptr(intra_row_mt_sync, mt_thread_id,
                                    mt_unit_col);
#if CONFIG_MULTITHREAD
      const int num_workers =
          AOMMIN(mt_info->num_mod_workers[MOD_AI], mt_info->num_workers);
      if (num_workers > 1) {
        const AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
        pthread_mutex_lock(enc_row_mt->mutex_);
        const bool exit = enc_row_mt->mb_wiener_mt_exit;
        pthread_mutex_unlock(enc_row_mt->mutex_);
        // Stop further processing in case any worker has encountered an error.
        if (exit) break;
      }
#endif
    }

    PREDICTION_MODE best_mode = DC_PRED;
    int best_intra_cost = INT_MAX;
    const int mi_width = mi_size_wide[bsize];
    const int mi_height = mi_size_high[bsize];
    set_mode_info_offsets(&cpi->common.mi_params, &cpi->mbmi_ext_info, x, xd,
                          mi_row, mi_col);
    set_mi_row_col(xd, &xd->tile, mi_row, mi_height, mi_col, mi_width,
                   AOMMIN(mi_row + mi_height, cm->mi_params.mi_rows),
                   AOMMIN(mi_col + mi_width, cm->mi_params.mi_cols));
    set_plane_n4(xd, mi_size_wide[bsize], mi_size_high[bsize],
                 av1_num_planes(cm));
    xd->mi[0]->bsize = bsize;
    xd->mi[0]->motion_mode = SIMPLE_TRANSLATION;
    // Set above and left mbmi to NULL as they are not available in the
    // preprocessing stage.
    // They are used to detemine intra edge filter types in intra prediction.
    if (xd->up_available) {
      xd->above_mbmi = NULL;
    }
    if (xd->left_available) {
      xd->left_mbmi = NULL;
    }
    uint8_t *mb_buffer =
        buffer + mi_row * MI_SIZE * buf_stride + mi_col * MI_SIZE;
    for (PREDICTION_MODE mode = INTRA_MODE_START; mode < INTRA_MODE_END;
         ++mode) {
      // TODO(chengchen): Here we use src instead of reconstructed frame as
      // the intra predictor to make single and multithread version match.
      // Ideally we want to use the reconstructed.
      av1_predict_intra_block(
          xd, cm->seq_params->sb_size, cm->seq_params->enable_intra_edge_filter,
          block_size, block_size, tx_size, mode, 0, 0, FILTER_INTRA_MODES,
          mb_buffer, buf_stride, dst_buffer, dst_buffer_stride, 0, 0, 0);
      av1_subtract_block(bd_info, block_size, block_size, src_diff, block_size,
                         mb_buffer, buf_stride, dst_buffer, dst_buffer_stride);
      av1_quick_txfm(0, tx_size, bd_info, src_diff, block_size, coeff);
      int intra_cost = aom_satd(coeff, coeff_count);
      if (intra_cost < best_intra_cost) {
        best_intra_cost = intra_cost;
        best_mode = mode;
      }
    }

    av1_predict_intra_block(
        xd, cm->seq_params->sb_size, cm->seq_params->enable_intra_edge_filter,
        block_size, block_size, tx_size, best_mode, 0, 0, FILTER_INTRA_MODES,
        mb_buffer, buf_stride, dst_buffer, dst_buffer_stride, 0, 0, 0);
    av1_subtract_block(bd_info, block_size, block_size, src_diff, block_size,
                       mb_buffer, buf_stride, dst_buffer, dst_buffer_stride);
    av1_quick_txfm(0, tx_size, bd_info, src_diff, block_size, coeff);

    const struct macroblock_plane *const p = &x->plane[0];
    uint16_t eob;
    const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
    QUANT_PARAM quant_param;
    int pix_num = 1 << num_pels_log2_lookup[txsize_to_bsize[tx_size]];
    av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_FP, 0, &quant_param);
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_cur_buf_hbd(xd)) {
      av1_highbd_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob,
                                    scan_order, &quant_param);
    } else {
      av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob,
                             scan_order, &quant_param);
    }
#else
    av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob, scan_order,
                           &quant_param);
#endif  // CONFIG_AV1_HIGHBITDEPTH

    if (cpi->oxcf.enable_rate_guide_deltaq) {
      const int rate_cost = rate_estimator(qcoeff, eob, tx_size);
      cpi->prep_rate_estimates[(mi_row / mb_step) * cpi->frame_info.mi_cols +
                               (mi_col / mb_step)] = rate_cost;
    }

    av1_inverse_transform_block(xd, dqcoeff, 0, DCT_DCT, tx_size, dst_buffer,
                                dst_buffer_stride, eob, 0);
    WeberStats *weber_stats =
        &cpi->mb_weber_stats[(mi_row / mb_step) * cpi->frame_info.mi_cols +
                             (mi_col / mb_step)];

    weber_stats->rec_pix_max = 1;
    weber_stats->rec_variance = 0;
    weber_stats->src_pix_max = 1;
    weber_stats->src_variance = 0;
    weber_stats->distortion = 0;

    int64_t src_mean = 0;
    int64_t rec_mean = 0;
    int64_t dist_mean = 0;

    for (int pix_row = 0; pix_row < block_size; ++pix_row) {
      for (int pix_col = 0; pix_col < block_size; ++pix_col) {
        int src_pix, rec_pix;
#if CONFIG_AV1_HIGHBITDEPTH
        if (is_cur_buf_hbd(xd)) {
          uint16_t *src = CONVERT_TO_SHORTPTR(mb_buffer);
          uint16_t *rec = CONVERT_TO_SHORTPTR(dst_buffer);
          src_pix = src[pix_row * buf_stride + pix_col];
          rec_pix = rec[pix_row * dst_buffer_stride + pix_col];
        } else {
          src_pix = mb_buffer[pix_row * buf_stride + pix_col];
          rec_pix = dst_buffer[pix_row * dst_buffer_stride + pix_col];
        }
#else
        src_pix = mb_buffer[pix_row * buf_stride + pix_col];
        rec_pix = dst_buffer[pix_row * dst_buffer_stride + pix_col];
#endif
        src_mean += src_pix;
        rec_mean += rec_pix;
        dist_mean += src_pix - rec_pix;
        weber_stats->src_variance += src_pix * src_pix;
        weber_stats->rec_variance += rec_pix * rec_pix;
        weber_stats->src_pix_max = AOMMAX(weber_stats->src_pix_max, src_pix);
        weber_stats->rec_pix_max = AOMMAX(weber_stats->rec_pix_max, rec_pix);
        weber_stats->distortion += (src_pix - rec_pix) * (src_pix - rec_pix);
      }
    }

    if (cpi->oxcf.intra_mode_cfg.auto_intra_tools_off) {
      *sum_rec_distortion += weber_stats->distortion;
      int est_block_rate = 0;
      int64_t est_block_dist = 0;
      model_rd_sse_fn[MODELRD_LEGACY](cpi, x, bsize, 0, weber_stats->distortion,
                                      pix_num, &est_block_rate,
                                      &est_block_dist);
      *sum_est_rate += est_block_rate;
    }

    weber_stats->src_variance -= (src_mean * src_mean) / pix_num;
    weber_stats->rec_variance -= (rec_mean * rec_mean) / pix_num;
    weber_stats->distortion -= (dist_mean * dist_mean) / pix_num;
    weber_stats->satd = best_intra_cost;

    qcoeff[0] = 0;
    int max_scale = 0;
    for (int idx = 1; idx < coeff_count; ++idx) {
      const int abs_qcoeff = abs(qcoeff[idx]);
      max_scale = AOMMAX(max_scale, abs_qcoeff);
    }
    weber_stats->max_scale = max_scale;

    if ((mi_col + mb_step) % mt_unit_step == 0 ||
        (mi_col + mb_step) >= mi_cols) {
      intra_mt->intra_sync_write_ptr(intra_row_mt_sync, mt_thread_id,
                                     mt_unit_col, mt_unit_cols);
      ++mt_unit_col;
    }
  }
  // Set the pointer to null since mbmi is only allocated inside this function.
  xd->mi = NULL;
}